

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O0

void __thiscall
yactfr::internal::JsonVarTypeValReq::JsonVarTypeValReq
          (JsonVarTypeValReq *this,JsonAnyFullDtValReq *anyFullDtValReq)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>
  __l;
  char *pcVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  *local_1a8;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>
  local_17c;
  key_equal local_17b;
  hasher local_17a;
  undefined1 local_179;
  undefined1 local_178 [40];
  __node_base local_150;
  optional<unsigned_long_long> local_148;
  undefined1 local_138 [48];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  local_108;
  element_type local_d0 [2];
  iterator local_98;
  size_type local_90;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>_>
  local_88;
  allocator local_39;
  string local_38;
  JsonAnyFullDtValReq *local_18;
  JsonAnyFullDtValReq *anyFullDtValReq_local;
  JsonVarTypeValReq *this_local;
  
  (this->super_JsonDtValReq).super_JsonObjValReq.super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonVarTypeValReq_007e00a0;
  local_18 = anyFullDtValReq;
  anyFullDtValReq_local = (JsonAnyFullDtValReq *)this;
  pcVar1 = typeStr();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,pcVar1,&local_39);
  local_179 = 1;
  local_138._40_8_ = local_138 + 0x30;
  local_150._M_nxt = (_Hash_node_base *)0x1;
  boost::optional<unsigned_long_long>::optional(&local_148,(rval_reference_type)&local_150);
  boost::optional<unsigned_long_long>::optional((optional<unsigned_long_long> *)(local_178 + 0x18));
  JsonVarTypeOptValReq::shared((JsonVarTypeOptValReq *)local_178,local_18);
  JsonArrayValReq::shared
            ((JsonArrayValReq *)local_138,&local_148,
             (optional<unsigned_long_long> *)(local_178 + 0x18),(Sp *)local_178);
  JsonObjValPropReq::JsonObjValPropReq((JsonObjValPropReq *)(local_138 + 0x10),(Sp *)local_138,true)
  ;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  ::pair<const_char_*const_&,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
              *)(local_138 + 0x30),(char **)&strs::opts,(JsonObjValPropReq *)(local_138 + 0x10));
  local_138._40_8_ = local_d0;
  (anonymous_namespace)::selLocPropReqEntry_abi_cxx11_();
  local_179 = 0;
  local_98 = (iterator)(local_138 + 0x30);
  local_90 = 2;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>
  ::allocator(&local_17c);
  __l._M_len = local_90;
  __l._M_array = local_98;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>_>
  ::unordered_map(&local_88,__l,0,&local_17a,&local_17b,&local_17c);
  JsonDtValReq::JsonDtValReq(&this->super_JsonDtValReq,&local_38,&local_88);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>_>
  ::~unordered_map(&local_88);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>
  ::~allocator(&local_17c);
  local_1a8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
               *)&local_98;
  do {
    local_1a8 = local_1a8 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
    ::~pair(local_1a8);
  } while (local_1a8 !=
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
            *)(local_138 + 0x30));
  JsonObjValPropReq::~JsonObjValPropReq((JsonObjValPropReq *)(local_138 + 0x10));
  std::shared_ptr<const_yactfr::internal::JsonValReq>::~shared_ptr
            ((shared_ptr<const_yactfr::internal::JsonValReq> *)local_138);
  std::shared_ptr<const_yactfr::internal::JsonValReq>::~shared_ptr
            ((shared_ptr<const_yactfr::internal::JsonValReq> *)local_178);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  (this->super_JsonDtValReq).super_JsonObjValReq.super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonVarTypeValReq_007e00a0;
  return;
}

Assistant:

explicit JsonVarTypeValReq(const JsonAnyFullDtValReq& anyFullDtValReq) :
        JsonDtValReq {this->typeStr(), {
            {strs::opts, {
                JsonArrayValReq::shared(1, boost::none,
                                        JsonVarTypeOptValReq::shared(anyFullDtValReq)),
                true
            }},
            selLocPropReqEntry(),
        }}
    {
    }